

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O1

short duckdb::DecimalParquetValueConversion<short,_true>::PlainRead<false>
                (ByteBuffer *plain_data,ColumnReader *reader)

{
  short sVar1;
  ulong req_len;
  
  req_len = (ulong)reader->column_schema->type_length;
  ByteBuffer::available(plain_data,req_len);
  sVar1 = ParquetDecimalUtils::ReadDecimalValue<short>
                    (plain_data->ptr,req_len,reader->column_schema);
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  return sVar1;
}

Assistant:

static DUCKDB_PHYSICAL_TYPE PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		idx_t byte_len;
		if (FIXED_LENGTH) {
			byte_len = reader.Schema().type_length;
		} else {
			byte_len = plain_data.read<uint32_t>();
		}
		plain_data.available(byte_len);
		auto res = ParquetDecimalUtils::ReadDecimalValue<DUCKDB_PHYSICAL_TYPE>(const_data_ptr_cast(plain_data.ptr),
		                                                                       byte_len, reader.Schema());

		plain_data.inc(byte_len);
		return res;
	}